

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O2

ConvexH * ConvexDecomposition::test_cube(void)

{
  Array<ConvexDecomposition::Plane> *this;
  undefined8 uVar1;
  ConvexH *this_00;
  float3 *pfVar2;
  Plane *pPVar3;
  HalfEdge *pHVar4;
  Array<ConvexDecomposition::ConvexH::HalfEdge> *this_01;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  this_00 = (ConvexH *)::operator_new(0x30);
  ConvexH::ConvexH(this_00,8,0x18,6);
  pfVar2 = Array<ConvexDecomposition::float3>::operator[]
                     ((Array<ConvexDecomposition::float3> *)this_00,0);
  pfVar2->x = 0.0;
  pfVar2->y = 0.0;
  pfVar2->z = 0.0;
  pfVar2 = Array<ConvexDecomposition::float3>::operator[]
                     ((Array<ConvexDecomposition::float3> *)this_00,1);
  pfVar2->x = 0.0;
  pfVar2->y = 0.0;
  pfVar2->z = 1.0;
  pfVar2 = Array<ConvexDecomposition::float3>::operator[]
                     ((Array<ConvexDecomposition::float3> *)this_00,2);
  pfVar2->x = 0.0;
  pfVar2->y = 1.0;
  pfVar2->z = 0.0;
  pfVar2 = Array<ConvexDecomposition::float3>::operator[]
                     ((Array<ConvexDecomposition::float3> *)this_00,3);
  pfVar2->x = 0.0;
  pfVar2->y = 1.0;
  pfVar2->z = 1.0;
  pfVar2 = Array<ConvexDecomposition::float3>::operator[]
                     ((Array<ConvexDecomposition::float3> *)this_00,4);
  uVar1 = vmovlps_avx(SUB6416(ZEXT464(0x3f800000),0));
  pfVar2->x = (float)(int)uVar1;
  pfVar2->y = (float)(int)((ulong)uVar1 >> 0x20);
  pfVar2->z = 0.0;
  pfVar2 = Array<ConvexDecomposition::float3>::operator[]
                     ((Array<ConvexDecomposition::float3> *)this_00,5);
  uVar1 = vmovlps_avx(SUB6416(ZEXT464(0x3f800000),0));
  pfVar2->x = (float)(int)uVar1;
  pfVar2->y = (float)(int)((ulong)uVar1 >> 0x20);
  pfVar2->z = 1.0;
  pfVar2 = Array<ConvexDecomposition::float3>::operator[]
                     ((Array<ConvexDecomposition::float3> *)this_00,6);
  auVar5._8_4_ = 0x3f800000;
  auVar5._0_8_ = 0x3f8000003f800000;
  auVar5._12_4_ = 0x3f800000;
  uVar1 = vmovlps_avx(auVar5);
  pfVar2->x = (float)(int)uVar1;
  pfVar2->y = (float)(int)((ulong)uVar1 >> 0x20);
  pfVar2->z = 0.0;
  pfVar2 = Array<ConvexDecomposition::float3>::operator[]
                     ((Array<ConvexDecomposition::float3> *)this_00,7);
  auVar6._8_4_ = 0x3f800000;
  auVar6._0_8_ = 0x3f8000003f800000;
  auVar6._12_4_ = 0x3f800000;
  uVar1 = vmovlps_avx(auVar6);
  pfVar2->x = (float)(int)uVar1;
  pfVar2->y = (float)(int)((ulong)uVar1 >> 0x20);
  pfVar2->z = 1.0;
  this = &this_00->facets;
  pPVar3 = Array<ConvexDecomposition::Plane>::operator[](this,0);
  *pPVar3 = SUB6416(ZEXT464(0xbf800000),0);
  pPVar3 = Array<ConvexDecomposition::Plane>::operator[](this,1);
  (pPVar3->normal).x = 1.0;
  (pPVar3->normal).y = 0.0;
  *(undefined8 *)&(pPVar3->normal).z = 0xbf80000000000000;
  pPVar3 = Array<ConvexDecomposition::Plane>::operator[](this,2);
  (pPVar3->normal).x = 0.0;
  (pPVar3->normal).y = -1.0;
  *(undefined8 *)&(pPVar3->normal).z = 0;
  pPVar3 = Array<ConvexDecomposition::Plane>::operator[](this,3);
  (pPVar3->normal).x = 0.0;
  (pPVar3->normal).y = 1.0;
  *(undefined8 *)&(pPVar3->normal).z = 0xbf80000000000000;
  pPVar3 = Array<ConvexDecomposition::Plane>::operator[](this,4);
  (pPVar3->normal).x = 0.0;
  (pPVar3->normal).y = 0.0;
  *(undefined8 *)&(pPVar3->normal).z = 0xbf800000;
  pPVar3 = Array<ConvexDecomposition::Plane>::operator[](this,5);
  this_01 = &this_00->edges;
  (pPVar3->normal).x = 0.0;
  (pPVar3->normal).y = 0.0;
  *(undefined8 *)&(pPVar3->normal).z = 0xbf8000003f800000;
  pHVar4 = Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[](this_01,0);
  pHVar4->ea = 0xb;
  pHVar4->v = '\0';
  pHVar4->p = '\0';
  pHVar4 = Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[](this_01,1);
  pHVar4->ea = 0x17;
  pHVar4->v = '\x01';
  pHVar4->p = '\0';
  pHVar4 = Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[](this_01,2);
  pHVar4->ea = 0xf;
  pHVar4->v = '\x03';
  pHVar4->p = '\0';
  pHVar4 = Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[](this_01,3);
  pHVar4->ea = 0x10;
  pHVar4->v = '\x02';
  pHVar4->p = '\0';
  pHVar4 = Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[](this_01,4);
  pHVar4->ea = 0xd;
  pHVar4->v = '\x06';
  pHVar4->p = '\x01';
  pHVar4 = Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[](this_01,5);
  pHVar4->ea = 0x15;
  pHVar4->v = '\a';
  pHVar4->p = '\x01';
  pHVar4 = Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[](this_01,6);
  pHVar4->ea = 9;
  pHVar4->v = '\x05';
  pHVar4->p = '\x01';
  pHVar4 = Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[](this_01,7);
  pHVar4->ea = 0x12;
  pHVar4->v = '\x04';
  pHVar4->p = '\x01';
  pHVar4 = Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[](this_01,8);
  pHVar4->ea = 0x13;
  pHVar4->v = '\0';
  pHVar4->p = '\x02';
  pHVar4 = Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[](this_01,9);
  pHVar4->ea = 6;
  pHVar4->v = '\x04';
  pHVar4->p = '\x02';
  pHVar4 = Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[](this_01,10);
  pHVar4->ea = 0x14;
  pHVar4->v = '\x05';
  pHVar4->p = '\x02';
  pHVar4 = Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[](this_01,0xb);
  pHVar4->ea = 0;
  pHVar4->v = '\x01';
  pHVar4->p = '\x02';
  pHVar4 = Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[](this_01,0xc);
  pHVar4->ea = 0x16;
  pHVar4->v = '\x03';
  pHVar4->p = '\x03';
  pHVar4 = Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[](this_01,0xd);
  pHVar4->ea = 4;
  pHVar4->v = '\a';
  pHVar4->p = '\x03';
  pHVar4 = Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[](this_01,0xe);
  pHVar4->ea = 0x11;
  pHVar4->v = '\x06';
  pHVar4->p = '\x03';
  pHVar4 = Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[](this_01,0xf);
  pHVar4->ea = 2;
  pHVar4->v = '\x02';
  pHVar4->p = '\x03';
  pHVar4 = Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[](this_01,0x10);
  pHVar4->ea = 3;
  pHVar4->v = '\0';
  pHVar4->p = '\x04';
  pHVar4 = Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[](this_01,0x11);
  pHVar4->ea = 0xe;
  pHVar4->v = '\x02';
  pHVar4->p = '\x04';
  pHVar4 = Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[](this_01,0x12);
  pHVar4->ea = 7;
  pHVar4->v = '\x06';
  pHVar4->p = '\x04';
  pHVar4 = Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[](this_01,0x13);
  pHVar4->ea = 8;
  pHVar4->v = '\x04';
  pHVar4->p = '\x04';
  pHVar4 = Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[](this_01,0x14);
  pHVar4->ea = 10;
  pHVar4->v = '\x01';
  pHVar4->p = '\x05';
  pHVar4 = Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[](this_01,0x15);
  pHVar4->ea = 5;
  pHVar4->v = '\x05';
  pHVar4->p = '\x05';
  pHVar4 = Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[](this_01,0x16);
  pHVar4->ea = 0xc;
  pHVar4->v = '\a';
  pHVar4->p = '\x05';
  pHVar4 = Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[](this_01,0x17);
  pHVar4->ea = 1;
  pHVar4->v = '\x03';
  pHVar4->p = '\x05';
  return this_00;
}

Assistant:

ConvexH *test_cube() {
	ConvexH *convex = new ConvexH(8,24,6);
	convex->vertices[0] = REAL3(0,0,0);
	convex->vertices[1] = REAL3(0,0,1);
	convex->vertices[2] = REAL3(0,1,0);
	convex->vertices[3] = REAL3(0,1,1);
	convex->vertices[4] = REAL3(1,0,0);
	convex->vertices[5] = REAL3(1,0,1);
	convex->vertices[6] = REAL3(1,1,0);
	convex->vertices[7] = REAL3(1,1,1);

	convex->facets[0] = Plane(REAL3(-1,0,0),0);
	convex->facets[1] = Plane(REAL3(1,0,0),-1);
	convex->facets[2] = Plane(REAL3(0,-1,0),0);
	convex->facets[3] = Plane(REAL3(0,1,0),-1);
	convex->facets[4] = Plane(REAL3(0,0,-1),0);
	convex->facets[5] = Plane(REAL3(0,0,1),-1);

	convex->edges[0 ] = HalfEdge(11,0,0);
	convex->edges[1 ] = HalfEdge(23,1,0);
	convex->edges[2 ] = HalfEdge(15,3,0);
	convex->edges[3 ] = HalfEdge(16,2,0);

	convex->edges[4 ] = HalfEdge(13,6,1);
	convex->edges[5 ] = HalfEdge(21,7,1);
	convex->edges[6 ] = HalfEdge( 9,5,1);
	convex->edges[7 ] = HalfEdge(18,4,1);

	convex->edges[8 ] = HalfEdge(19,0,2);
	convex->edges[9 ] = HalfEdge( 6,4,2);
	convex->edges[10] = HalfEdge(20,5,2);
	convex->edges[11] = HalfEdge( 0,1,2);

	convex->edges[12] = HalfEdge(22,3,3);
	convex->edges[13] = HalfEdge( 4,7,3);
	convex->edges[14] = HalfEdge(17,6,3);
	convex->edges[15] = HalfEdge( 2,2,3);

	convex->edges[16] = HalfEdge( 3,0,4);
	convex->edges[17] = HalfEdge(14,2,4);
	convex->edges[18] = HalfEdge( 7,6,4);
	convex->edges[19] = HalfEdge( 8,4,4);
	
	convex->edges[20] = HalfEdge(10,1,5);
	convex->edges[21] = HalfEdge( 5,5,5);
	convex->edges[22] = HalfEdge(12,7,5);
	convex->edges[23] = HalfEdge( 1,3,5);

	
	return convex;
}